

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O1

void place_branch(level *lev,branch *br,xchar x,xchar y)

{
  d_level *lev1;
  boolean bVar1;
  uint uVar2;
  ulong extraout_RAX;
  ulong uVar3;
  char cVar4;
  undefined7 in_register_00000009;
  char cVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  d_level *src;
  mkroom *croom;
  coord m;
  coord local_3e;
  undefined4 local_3c;
  branch *local_38;
  
  if ((br != (branch *)0x0) && ((made_branch & 1) == 0)) {
    iVar8 = lev->nroom;
    if (x == '\0') {
      if (iVar8 == 0) {
        mazexy(lev,&local_3e);
        croom = (mkroom *)0x0;
        uVar3 = extraout_RAX;
      }
      else {
        if (iVar8 < 3) {
          uVar7 = mt_random();
          croom = lev->rooms + SUB168(ZEXT416(uVar7) % SEXT816((long)iVar8),0);
        }
        else {
          uVar7 = 0;
          while( true ) {
            iVar8 = lev->nroom;
            uVar2 = mt_random();
            croom = lev->rooms + SUB168(ZEXT416(uVar2) % SEXT816((long)iVar8),0);
            if ((((croom != lev->dnstairs_room) && (croom != lev->upstairs_room)) &&
                (croom->rtype == '\0')) || (0x62 < uVar7)) break;
            uVar7 = uVar7 + 1;
          }
        }
        do {
          bVar1 = somexy(lev,croom,&local_3e);
          if (bVar1 == '\0') {
            impossible("Can\'t place branch!");
          }
          bVar1 = occupied(lev,local_3e.x,local_3e.y);
        } while ((bVar1 != '\0') ||
                (uVar3 = CONCAT71((int7)((ulong)(lev->locations + local_3e.x) >> 8),
                                  lev->locations[local_3e.x][local_3e.y].typ) & 0xfffffffffffffffe,
                (char)uVar3 != '\x18'));
      }
      local_3c = (undefined4)CONCAT71((int7)(uVar3 >> 8),local_3e.y);
      x = local_3e.x;
    }
    else {
      local_3c = (undefined4)CONCAT71(in_register_00000009,y);
      if (iVar8 < 1) {
        croom = (mkroom *)0x0;
      }
      else {
        croom = lev->rooms;
        iVar8 = 0;
        local_38 = br;
        do {
          bVar1 = inside_room(croom,x,y);
          br = local_38;
          if (bVar1 != '\0') goto LAB_001d87ef;
          croom = croom + 1;
          iVar8 = iVar8 + 1;
        } while (iVar8 < lev->nroom);
        croom = (mkroom *)0x0;
      }
    }
LAB_001d87ef:
    lev1 = &br->end1;
    bVar1 = on_level(lev1,&lev->z);
    src = &br->end2;
    if (bVar1 == '\0') {
      src = lev1;
    }
    if (br->type == 3) {
      mkportal(lev,x,(xchar)local_3c,src->dnum,src->dlevel);
    }
    else if (br->type != (bVar1 == '\0') + 1) {
      (lev->sstairs).sx = x;
      (lev->sstairs).sy = (xchar)local_3c;
      bVar1 = on_level(lev1,&lev->z);
      cVar4 = (char)*(undefined4 *)&br->end1_up;
      cVar5 = cVar4 == '\0';
      if (bVar1 != '\0') {
        cVar5 = cVar4;
      }
      (lev->sstairs).up = cVar5;
      assign_level(&(lev->sstairs).tolev,src);
      lev->sstairs_room = croom;
      lVar6 = (long)(xchar)local_3c;
      *(uint *)&lev->locations[x][lVar6].field_0x6 =
           (uint)((lev->sstairs).up == '\0') * 0x10 +
           (*(uint *)&lev->locations[x][lVar6].field_0x6 & 0xfffffe0f) + 0x10;
      lev->locations[x][lVar6].typ = '\x1a';
    }
    made_branch = 1;
  }
  return;
}

Assistant:

void place_branch(struct level *lev,
		  branch *br,		/* branch to place */
		  xchar x,  xchar y)	/* location */
{
	coord	      m;
	d_level	      *dest;
	boolean	      make_stairs;
	struct mkroom *br_room;

	/*
	 * Return immediately if there is no branch to make or we have
	 * already made one.  This routine can be called twice when
	 * a special level is loaded that specifies an SSTAIR location
	 * as a favored spot for a branch.
	 */
	if (!br || made_branch) return;

	if (!x) {	/* find random coordinates for branch */
	    br_room = find_branch_room(lev, &m);
	    x = m.x;
	    y = m.y;
	} else {
	    br_room = pos_to_room(lev, x, y);
	}

	if (on_level(&br->end1, &lev->z)) {
	    /* we're on end1 */
	    make_stairs = br->type != BR_NO_END1;
	    dest = &br->end2;
	} else {
	    /* we're on end2 */
	    make_stairs = br->type != BR_NO_END2;
	    dest = &br->end1;
	}

	if (br->type == BR_PORTAL) {
	    mkportal(lev, x, y, dest->dnum, dest->dlevel);
	} else if (make_stairs) {
	    lev->sstairs.sx = x;
	    lev->sstairs.sy = y;
	    lev->sstairs.up = (char) on_level(&br->end1, &lev->z) ?
					    br->end1_up : !br->end1_up;
	    assign_level(&lev->sstairs.tolev, dest);
	    lev->sstairs_room = br_room;

	    lev->locations[x][y].ladder = lev->sstairs.up ? LA_UP : LA_DOWN;
	    lev->locations[x][y].typ = STAIRS;
	}
	/*
	 * Set made_branch to TRUE even if we didn't make a stairwell (i.e.
	 * make_stairs is false) since there is currently only one branch
	 * per level, if we failed once, we're going to fail again on the
	 * next call.
	 */
	made_branch = TRUE;
}